

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer3.cpp
# Opt level: O0

void __thiscall Producer::operator()(Producer *this)

{
  ostream *poVar1;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  void *this_00;
  int *in_RSI;
  int local_24;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  int local_14;
  Producer *pPStack_10;
  int i;
  Producer *this_local;
  
  pPStack_10 = this;
  for (local_14 = 0; local_14 < this->numberOfMessages_; local_14 = local_14 + 1) {
    local_24 = 1000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_20,&local_24);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
    poVar1 = std::operator<<((ostream *)&std::cout,"Producer (id#");
    __id = std::this_thread::get_id();
    pbVar2 = std::operator<<(poVar1,__id);
    poVar1 = std::operator<<(pbVar2,"): ");
    this_00 = (void *)std::ostream::operator<<(poVar1,local_14);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    in_RSI = &local_14;
    rtb::Concurrency::Queue<int>::push(this->outputQueue_,in_RSI);
  }
  rtb::Concurrency::Queue<int>::close(this->outputQueue_,(int)in_RSI);
  return;
}

Assistant:

void operator()() {
        for (int i{ 0 }; i < numberOfMessages_; ++i) {
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            cout << "Producer (id#" << std::this_thread::get_id() << "): " << i << endl;
            outputQueue_.push(i);
        }
        outputQueue_.close();
    }